

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_adds_a_d_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  float64 fVar1;
  int64_t iVar2;
  
  fVar1 = msa_adds_a_df(3,(env->active_fpu).fpr[ws].fd,(env->active_fpu).fpr[wt].fd);
  (env->active_fpu).fpr[wd].fd = fVar1;
  iVar2 = msa_adds_a_df(3,*(int64_t *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8),
                        *(int64_t *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8));
  *(int64_t *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = iVar2;
  return;
}

Assistant:

void helper_msa_adds_a_d(CPUMIPSState *env,
                         uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->d[0]  = msa_adds_a_df(DF_DOUBLE, pws->d[0],  pwt->d[0]);
    pwd->d[1]  = msa_adds_a_df(DF_DOUBLE, pws->d[1],  pwt->d[1]);
}